

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O2

SequenceCatalogEntry *
duckdb::BindSequenceFromContext(ClientContext *context,string *catalog,string *schema,string *name)

{
  SequenceCatalogEntry *pSVar1;
  
  Binder::BindSchemaOrCatalog(context,catalog,schema);
  pSVar1 = Catalog::GetEntry<duckdb::SequenceCatalogEntry>
                     (context,catalog,schema,name,(QueryErrorContext)0xffffffffffffffff);
  return pSVar1;
}

Assistant:

SequenceCatalogEntry &BindSequenceFromContext(ClientContext &context, string &catalog, string &schema,
                                              const string &name) {
	Binder::BindSchemaOrCatalog(context, catalog, schema);
	return Catalog::GetEntry<SequenceCatalogEntry>(context, catalog, schema, name);
}